

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

void __thiscall ON_String::Destroy(ON_String *this)

{
  ON_Internal_Empty_aString *memblock;
  char *pcVar1;
  
  pcVar1 = this->m_s;
  memblock = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
  if ((memblock != &empty_astring && pcVar1 != (char *)0x0) &&
     (0 < (memblock->header).ref_count.super___atomic_base<int>._M_i)) {
    LOCK();
    (memblock->header).ref_count.super___atomic_base<int>._M_i =
         (memblock->header).ref_count.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((memblock->header).ref_count.super___atomic_base<int>._M_i == 0) {
      pcVar1[-8] = '\0';
      pcVar1[-7] = '\0';
      pcVar1[-6] = '\0';
      pcVar1[-5] = '\0';
      pcVar1[-4] = '\0';
      pcVar1[-3] = '\0';
      pcVar1[-2] = '\0';
      pcVar1[-1] = '\0';
      onfree(memblock);
    }
  }
  this->m_s = (char *)0x8420e4;
  return;
}

Assistant:

void ON_String::Destroy()
{
  ON_aStringHeader* hdr = Header();
  if (hdr != pEmptyStringHeader && nullptr != hdr && (int)(hdr->ref_count) > 0)
    ON_aStringHeader_DecrementRefCountAndDeleteIfZero(hdr);
	Create();
}